

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O2

UnitNode * enqueue(UnitList *queue,void *unit)

{
  int iVar1;
  UnitNode *pUVar2;
  UnitNode *pUVar3;
  UnitNode *pUVar4;
  UnitNode *pUVar5;
  
  pUVar2 = (UnitNode *)malloc(0x18);
  pUVar2->unit = unit;
  iVar1 = queue->count;
  if (iVar1 == 0) {
    queue->tail = pUVar2;
    pUVar4 = (UnitNode *)0x0;
    pUVar5 = (UnitNode *)0x0;
    pUVar3 = pUVar2;
  }
  else {
    pUVar5 = queue->head;
    pUVar2->prev = (UnitNode *)0x0;
    pUVar3 = pUVar5;
    pUVar4 = pUVar2;
  }
  pUVar3->prev = pUVar4;
  queue->head = pUVar2;
  pUVar2->next = pUVar5;
  queue->count = iVar1 + 1;
  return pUVar2;
}

Assistant:

struct UnitNode *enqueue(struct UnitList *queue, void *unit) {

    struct UnitNode *newNode = malloc(sizeof(struct UnitNode));
    newNode->unit = unit;

    if (queue->count) {
        newNode->next = queue->head;
        newNode->prev = NULL;
        queue->head = newNode;
        queue->head->next->prev = newNode;

    } else {
        queue->head = newNode;
        queue->tail = newNode;
        newNode->next = NULL;
        newNode->prev = NULL;
    }

    queue->count++;

    return newNode;

}